

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtimeline.cpp
# Opt level: O3

void QTimeLine::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int msecs;
  parameter_type t;
  parameter_type *ppVar1;
  code *pcVar2;
  long lVar3;
  QTimeLinePrivate *this;
  QBindingStatus *pQVar4;
  undefined8 uVar5;
  parameter_type pVar6;
  long *plVar7;
  QBindableInterface *pQVar8;
  QUntypedPropertyData *data;
  QObjectData *pQVar9;
  long in_FS_OFFSET;
  undefined1 local_29;
  undefined8 local_28;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        valueChanged(*_a[1],_o);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        frameChanged((QTimeLine *)_o,*_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        stateChanged((QTimeLine *)_o,*_a[1]);
        return;
      }
      break;
    case 3:
      local_28 = Forward;
      local_20 = &local_29;
      QMetaObject::activate(_o,&staticMetaObject,3,(void **)&local_28);
      goto switchD_003e9425_caseD_3;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        start((QTimeLine *)_o);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        resume((QTimeLine *)_o);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        stop((QTimeLine *)_o);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setPaused((QTimeLine *)_o,*_a[1]);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCurrentTime((QTimeLine *)_o,*_a[1]);
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        toggleDirection((QTimeLine *)_o);
        return;
      }
      break;
    default:
      goto switchD_003e9425_caseD_3;
    }
    goto LAB_003e98f1;
  case ReadProperty:
    if (5 < (uint)_id) break;
    ppVar1 = (parameter_type *)*_a;
    switch(_id) {
    case 0:
      pVar6 = QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_duration_offset,_&QTimeLinePrivate::setDuration,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_duration_offset,_&QTimeLinePrivate::setDuration,_nullptr,_nullptr>
                       *)((long)&(_o->d_ptr).d[1].bindingStorage.bindingStatus + 4));
      break;
    case 1:
      pQVar9 = (_o->d_ptr).d;
      data = (QUntypedPropertyData *)&pQVar9[2].q_ptr;
      goto LAB_003e96c0;
    case 2:
      pVar6 = QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
                       *)((long)&(_o->d_ptr).d[2].parent + 4));
      break;
    case 3:
      pVar6 = QObjectCompatProperty<QTimeLinePrivate,_QTimeLine::Direction,_&QTimeLinePrivate::_qt_property_direction_offset,_&QTimeLinePrivate::setDirection,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QTimeLinePrivate,_QTimeLine::Direction,_&QTimeLinePrivate::_qt_property_direction_offset,_&QTimeLinePrivate::setDirection,_nullptr,_nullptr>
                       *)&(_o->d_ptr).d[2].children);
      break;
    case 4:
      pQVar9 = (_o->d_ptr).d;
      data = (QUntypedPropertyData *)((long)&pQVar9[2].q_ptr + 4);
LAB_003e96c0:
      pQVar4 = (pQVar9->bindingStorage).bindingStatus;
      if ((pQVar4 != (QBindingStatus *)0x0) &&
         (pQVar4->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(&pQVar9->bindingStorage,data);
      }
      pVar6 = *(parameter_type *)data;
      break;
    case 5:
      easingCurve((QTimeLine *)&local_28);
      uVar5 = *(undefined8 *)ppVar1;
      *(undefined8 *)ppVar1 = local_28;
      local_28 = uVar5;
      QEasingCurve::~QEasingCurve((QEasingCurve *)&local_28);
      goto switchD_003e9425_caseD_3;
    }
    *ppVar1 = pVar6;
    break;
  case WriteProperty:
    if ((uint)_id < 6) {
      t = (parameter_type)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDuration((QTimeLine *)_o,*(int *)&t->d_ptr);
          return;
        }
        break;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_updateInterval_offset,_nullptr>
          ::setValue((QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_updateInterval_offset,_nullptr>
                      *)&(_o->d_ptr).d[2].q_ptr,*(parameter_type *)&t->d_ptr);
          return;
        }
        break;
      case 2:
        msecs = *(int *)&t->d_ptr;
        this = (QTimeLinePrivate *)(_o->d_ptr).d;
        this->startTime = 0;
        this->currentLoopCount = 0;
        QElapsedTimer::start(&this->timer);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QTimeLinePrivate::setCurrentTime(this,msecs);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDirection((QTimeLine *)_o,*(Direction *)&t->d_ptr);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_loopCount_offset,_nullptr>
          ::setValue((QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_loopCount_offset,_nullptr>
                      *)((long)&(_o->d_ptr).d[2].q_ptr + 4),*(parameter_type *)&t->d_ptr);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QObjectBindableProperty<QTimeLinePrivate,_QEasingCurve,_&QTimeLinePrivate::_qt_property_easingCurve_offset,_nullptr>
          ::setValue((QObjectBindableProperty<QTimeLinePrivate,_QEasingCurve,_&QTimeLinePrivate::_qt_property_easingCurve_offset,_nullptr>
                      *)&(_o->d_ptr).d[1].bindingStorage,t);
          return;
        }
      }
      goto LAB_003e98f1;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == valueChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == frameChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == stateChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == finished && lVar3 == 0) {
      *(undefined4 *)*_a = 3;
    }
    break;
  case BindableProperty:
    switch(_id) {
    case 0:
      plVar7 = (long *)*_a;
      *plVar7 = (long)((long)&(_o->d_ptr).d[1].bindingStorage.bindingStatus + 4);
      pQVar8 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_duration_offset,_&QTimeLinePrivate::setDuration,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 1:
      plVar7 = (long *)*_a;
      *plVar7 = (long)&(_o->d_ptr).d[2].q_ptr;
      pQVar8 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_updateInterval_offset,_nullptr>,_void>
                ::iface;
      break;
    case 2:
      plVar7 = (long *)*_a;
      *plVar7 = (long)((long)&(_o->d_ptr).d[2].parent + 4);
      pQVar8 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 3:
      plVar7 = (long *)*_a;
      *plVar7 = (long)&(_o->d_ptr).d[2].children;
      pQVar8 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QTimeLinePrivate,_QTimeLine::Direction,_&QTimeLinePrivate::_qt_property_direction_offset,_&QTimeLinePrivate::setDirection,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 4:
      plVar7 = (long *)*_a;
      *plVar7 = (long)((long)&(_o->d_ptr).d[2].q_ptr + 4);
      pQVar8 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_loopCount_offset,_nullptr>,_void>
                ::iface;
      break;
    case 5:
      plVar7 = (long *)*_a;
      *plVar7 = (long)&(_o->d_ptr).d[1].bindingStorage;
      pQVar8 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QTimeLinePrivate,_QEasingCurve,_&QTimeLinePrivate::_qt_property_easingCurve_offset,_nullptr>,_void>
                ::iface;
      break;
    default:
      goto switchD_003e9425_caseD_3;
    }
    plVar7[1] = (long)pQVar8;
  }
switchD_003e9425_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003e98f1:
  __stack_chk_fail();
}

Assistant:

void QTimeLine::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTimeLine *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1])), QPrivateSignal()); break;
        case 1: _t->frameChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])), QPrivateSignal()); break;
        case 2: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QTimeLine::State>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->finished(QPrivateSignal()); break;
        case 4: _t->start(); break;
        case 5: _t->resume(); break;
        case 6: _t->stop(); break;
        case 7: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setCurrentTime((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->toggleDirection(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(qreal , QPrivateSignal)>(_a, &QTimeLine::valueChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(int , QPrivateSignal)>(_a, &QTimeLine::frameChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(QTimeLine::State , QPrivateSignal)>(_a, &QTimeLine::stateChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(QPrivateSignal)>(_a, &QTimeLine::finished, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->updateInterval(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentTime(); break;
        case 3: *reinterpret_cast<Direction*>(_v) = _t->direction(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->loopCount(); break;
        case 5: *reinterpret_cast<QEasingCurve*>(_v) = _t->easingCurve(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDuration(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setUpdateInterval(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setCurrentTime(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setDirection(*reinterpret_cast<Direction*>(_v)); break;
        case 4: _t->setLoopCount(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setEasingCurve(*reinterpret_cast<QEasingCurve*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDuration(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableUpdateInterval(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentTime(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDirection(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableLoopCount(); break;
        case 5: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableEasingCurve(); break;
        default: break;
        }
    }
}